

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Get64(int g_a,int64_t *lo,int64_t *hi,void *buf,int64_t *ld)

{
  Integer IVar1;
  int64_t *piVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  int64_t aiStack_f8 [2];
  Integer aIStack_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [8];
  
  aiStack_f8[1] = 0x10aa20;
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar5 = &lStack_70 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = lo[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  plVar5 = &lStack_b0 + IVar1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = hi[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  lVar4 = 0;
  lVar3 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar3 = lVar4;
  }
  piVar2 = aiStack_f8 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *piVar2 = ld[lVar4];
    piVar2 = piVar2 + -1;
  }
  aiStack_f8[1] = 0x10aab6;
  pnga_get((long)g_a,local_68,local_a8,buf,aIStack_e8);
  return;
}

Assistant:

void NGA_Get64(int g_a, int64_t lo[], int64_t hi[], void* buf, int64_t ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_get(a, _ga_lo, _ga_hi, buf, _ga_work);
}